

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O3

void __thiscall ViewTest::indexToCoordinatesTest<false>(ViewTest *this)

{
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var1;
  unsigned_long *puVar2;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var3;
  unsigned_long uVar4;
  logic_error *plVar5;
  ulong uVar6;
  unsigned_long uVar7;
  unsigned_long uVar8;
  value_type *__val_1;
  value_type *__val_3;
  size_t sVar9;
  value_type *__val_2;
  value_type *__val;
  View<int,_false,_std::allocator<unsigned_long>_> v;
  allocator_type local_79;
  CoordinateOrder local_78 [2];
  undefined1 local_70 [16];
  size_t *local_60;
  size_t local_48;
  
  _Var1._M_current = (unsigned_long *)operator_new(0x18);
  *_Var1._M_current = 3;
  _Var1._M_current[1] = 2;
  _Var1._M_current[2] = 4;
  local_78[1] = 1;
  local_78[0] = LastMajorOrder;
  local_70._0_8_ = this->data_;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_70 + 8),_Var1,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(_Var1._M_current + 3),local_78 + 1,local_78,&local_79);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_70);
  puVar2 = (unsigned_long *)operator_new(0x18);
  *puVar2 = 0;
  puVar2[1] = 0;
  puVar2[2] = 0;
  uVar7 = _Var1._M_current[2];
  if (uVar7 != 0) {
    uVar4 = _Var1._M_current[1];
    uVar8 = 0;
    sVar9 = 0;
    uVar6 = uVar4;
    do {
      puVar2[1] = 0;
      if (uVar6 == 0) {
        uVar6 = 0;
      }
      else {
        uVar6 = *_Var1._M_current;
        uVar7 = 0;
        do {
          *puVar2 = 0;
          if (uVar6 == 0) {
            uVar6 = 0;
          }
          else {
            do {
              _Var3._M_current = (unsigned_long *)operator_new(0x18);
              *_Var3._M_current = 0;
              _Var3._M_current[1] = 0;
              _Var3._M_current[2] = 0;
              andres::View<int,false,std::allocator<unsigned_long>>::
              indexToCoordinates<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                        ((View<int,false,std::allocator<unsigned_long>> *)local_70,sVar9,_Var3);
              if (((*_Var3._M_current != *puVar2) || (_Var3._M_current[1] != puVar2[1])) ||
                 (_Var3._M_current[2] != puVar2[2])) {
                plVar5 = (logic_error *)__cxa_allocate_exception(0x10);
                std::logic_error::logic_error(plVar5,"test failed.");
                __cxa_throw(plVar5,&std::logic_error::typeinfo,std::logic_error::~logic_error);
              }
              sVar9 = sVar9 + 1;
              operator_delete(_Var3._M_current,0x18);
              uVar7 = *puVar2;
              *puVar2 = uVar7 + 1;
              uVar6 = *_Var1._M_current;
            } while (uVar7 + 1 < uVar6);
            uVar7 = puVar2[1];
            uVar4 = _Var1._M_current[1];
          }
          uVar7 = uVar7 + 1;
          puVar2[1] = uVar7;
        } while (uVar7 < uVar4);
        uVar8 = puVar2[2];
        uVar7 = _Var1._M_current[2];
        uVar6 = uVar4;
      }
      uVar8 = uVar8 + 1;
      puVar2[2] = uVar8;
    } while (uVar8 < uVar7);
  }
  operator_delete(puVar2,0x18);
  operator_delete(local_60,local_48 * 0x18);
  operator_delete(_Var1._M_current,0x18);
  _Var1._M_current = (unsigned_long *)operator_new(0x18);
  *_Var1._M_current = 3;
  _Var1._M_current[1] = 2;
  _Var1._M_current[2] = 4;
  local_78[1] = 1;
  local_78[0] = FirstMajorOrder;
  local_70._0_8_ = this->data_;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_70 + 8),_Var1,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(_Var1._M_current + 3),local_78 + 1,local_78,&local_79);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_70);
  puVar2 = (unsigned_long *)operator_new(0x18);
  *puVar2 = 0;
  puVar2[1] = 0;
  puVar2[2] = 0;
  uVar7 = *_Var1._M_current;
  if (uVar7 != 0) {
    uVar4 = _Var1._M_current[1];
    uVar8 = 0;
    sVar9 = 0;
    uVar6 = uVar4;
    do {
      puVar2[1] = 0;
      if (uVar6 == 0) {
        uVar6 = 0;
      }
      else {
        uVar6 = _Var1._M_current[2];
        uVar7 = 0;
        do {
          puVar2[2] = 0;
          if (uVar6 == 0) {
            uVar6 = 0;
          }
          else {
            do {
              _Var3._M_current = (unsigned_long *)operator_new(0x18);
              *_Var3._M_current = 0;
              _Var3._M_current[1] = 0;
              _Var3._M_current[2] = 0;
              andres::View<int,false,std::allocator<unsigned_long>>::
              indexToCoordinates<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                        ((View<int,false,std::allocator<unsigned_long>> *)local_70,sVar9,_Var3);
              if (((*_Var3._M_current != *puVar2) || (_Var3._M_current[1] != puVar2[1])) ||
                 (_Var3._M_current[2] != puVar2[2])) {
                plVar5 = (logic_error *)__cxa_allocate_exception(0x10);
                std::logic_error::logic_error(plVar5,"test failed.");
                __cxa_throw(plVar5,&std::logic_error::typeinfo,std::logic_error::~logic_error);
              }
              sVar9 = sVar9 + 1;
              operator_delete(_Var3._M_current,0x18);
              uVar7 = puVar2[2];
              puVar2[2] = uVar7 + 1;
              uVar6 = _Var1._M_current[2];
            } while (uVar7 + 1 < uVar6);
            uVar7 = puVar2[1];
            uVar4 = _Var1._M_current[1];
          }
          uVar7 = uVar7 + 1;
          puVar2[1] = uVar7;
        } while (uVar7 < uVar4);
        uVar8 = *puVar2;
        uVar7 = *_Var1._M_current;
        uVar6 = uVar4;
      }
      uVar8 = uVar8 + 1;
      *puVar2 = uVar8;
    } while (uVar8 < uVar7);
  }
  operator_delete(puVar2,0x18);
  operator_delete(local_60,local_48 * 0x18);
  operator_delete(_Var1._M_current,0x18);
  return;
}

Assistant:

void ViewTest::indexToCoordinatesTest() {
    // internalFirstMajorOrder == false
    {
        std::vector<std::size_t> shape(3);
        shape[0] = 3;
        shape[1] = 2;
        shape[2] = 4;
        andres::View<int, constTarget> v(shape.begin(), shape.end(),
            data_, andres::LastMajorOrder, andres::LastMajorOrder);

        std::vector<std::size_t> c(3);
        std::size_t index = 0;
        for(c[2]=0; c[2]<shape[2]; ++c[2]) 
        for(c[1]=0; c[1]<shape[1]; ++c[1])
        for(c[0]=0; c[0]<shape[0]; ++c[0]) {
            std::vector<std::size_t> d(3);
            v.indexToCoordinates(index, d.begin());
            test(d[0] == c[0] && d[1] == c[1] && d[2] == c[2]);
            ++index;
        }
    }
    // internalFirstMajorOrder == true
    {
        std::vector<std::size_t> shape(3);
        shape[0] = 3;
        shape[1] = 2;
        shape[2] = 4;
        andres::View<int, constTarget> v(shape.begin(), shape.end(),
            data_, andres::LastMajorOrder, andres::FirstMajorOrder);

        std::vector<std::size_t> c(3);
        std::size_t index = 0;
        for(c[0]=0; c[0]<shape[0]; ++c[0]) 
        for(c[1]=0; c[1]<shape[1]; ++c[1])
        for(c[2]=0; c[2]<shape[2]; ++c[2]) {
            std::vector<std::size_t> d(3);
            v.indexToCoordinates(index, d.begin());
            test(d[0] == c[0] && d[1] == c[1] && d[2] == c[2]);
            ++index;
        }
    }
}